

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  
  pRVar3 = this->rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_002b5d91:
    Reserve(this,this->total_size_ + 1);
  }
  else {
    iVar1 = this->current_size_;
    if (iVar1 == this->total_size_) goto LAB_002b5d91;
    iVar2 = pRVar3->allocated_size;
    if (iVar2 == this->total_size_) {
      if (((long *)pRVar3->elements[iVar1] != (long *)0x0) && (this->arena_ == (Arena *)0x0)) {
        (**(code **)(*pRVar3->elements[iVar1] + 8))();
      }
      goto LAB_002b5da5;
    }
    if (iVar2 <= iVar1) {
      pRVar3->allocated_size = iVar2 + 1;
      goto LAB_002b5da5;
    }
    pRVar3->elements[iVar2] = pRVar3->elements[iVar1];
  }
  this->rep_->allocated_size = this->rep_->allocated_size + 1;
LAB_002b5da5:
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = value;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(rep_->elements[current_size_]),
                        arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}